

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

void __thiscall
wavingz::encoder<signed_char>::encoder
          (encoder<signed_char> *this,size_t sample_rate,size_t baud_rate,double A)

{
  size_t sVar1;
  runtime_error *this_00;
  int __x;
  iir_filter<6> *this_01;
  double extraout_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_118;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_a0;
  double local_28;
  double A_local;
  size_t baud_rate_local;
  size_t sample_rate_local;
  encoder<signed_char> *this_local;
  
  this->A = A;
  local_28 = A;
  A_local = (double)baud_rate;
  baud_rate_local = sample_rate;
  sample_rate_local = (size_t)this;
  complex8_convert<signed_char>::complex8_convert(&this->convert_iq,this->A);
  this->sample_rate = baud_rate_local;
  this->baud_rate = (size_t)A_local;
  this->Ts = baud_rate_local / (ulong)A_local;
  auVar2._8_4_ = (int)(baud_rate_local >> 0x20);
  auVar2._0_8_ = baud_rate_local;
  auVar2._12_4_ = 0x45300000;
  butter_lp<6>(&local_a0,
               (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)baud_rate_local) - 4503599627370496.0),125000.0);
  iir_filter<6>::iir_filter(&this->lp1,&local_a0);
  this_01 = &this->lp2;
  auVar3._8_4_ = (int)(baud_rate_local >> 0x20);
  auVar3._0_8_ = baud_rate_local;
  auVar3._12_4_ = 0x45300000;
  butter_lp<6>(&local_118,
               (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)baud_rate_local) - 4503599627370496.0),125000.0);
  iir_filter<6>::iir_filter(this_01,&local_118);
  __x = (int)this_01;
  sVar1 = this->Ts;
  auVar4._8_4_ = (int)(sVar1 >> 0x20);
  auVar4._0_8_ = sVar1;
  auVar4._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)(baud_rate_local >> 0x20);
  auVar6._0_8_ = baud_rate_local;
  auVar6._12_4_ = 0x45300000;
  sin((((auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 62831.853071795864) /
      ((auVar6._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)baud_rate_local) - 4503599627370496.0)));
  sVar1 = this->Ts;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)(baud_rate_local >> 0x20);
  auVar7._0_8_ = baud_rate_local;
  auVar7._12_4_ = 0x45300000;
  sin((((auVar5._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 314159.26535897935) /
      ((auVar7._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)baud_rate_local) - 4503599627370496.0)));
  std::abs(__x);
  if (1e-12 < extraout_XMM0_Qa) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Please choose sample_rate and baud_rate so that the resulting phase will be coherent with the (1/2) separation frequency (20KHz)."
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

encoder(size_t sample_rate, size_t baud_rate, double A = 100.0)
        : A(A)
        , sample_rate(sample_rate)
        , baud_rate(baud_rate), Ts(sample_rate / baud_rate)
        , lp1(butter_lp<6>(sample_rate, f1_mul * dfreq * 2.5))
        , lp2(butter_lp<6>(sample_rate, f1_mul * dfreq * 2.5))

    {
        if (std::abs(sin(2.0 * M_PI * dfreq * f0_mul * (double)Ts / sample_rate) -
                     sin(2.0 * M_PI * dfreq * f1_mul * (double)Ts / sample_rate)) > 1e-12)
        {
            throw std::runtime_error(
                "Please choose sample_rate and baud_rate so "
                "that the resulting phase will be coherent "
                "with the (1/2) separation frequency (20KHz).");
        }
    }